

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O3

sysbvm_tuple_t
sysbvm_simpleFunctionType_primitiveAnalyzeAndTypeCheckMessageSendNode
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  long lVar1;
  ulong uVar2;
  uint uVar3;
  sysbvm_tuple_t sVar4;
  sysbvm_tuple_t slotCount;
  anon_struct_40_5_ec72e70e gcFrame;
  sysbvm_tuple_t local_88;
  sysbvm_tuple_t sStack_80;
  sysbvm_tuple_t local_78;
  sysbvm_tuple_t sStack_70;
  sysbvm_tuple_t local_68;
  sysbvm_stackFrameRecord_t local_58;
  undefined8 local_48;
  undefined1 *local_40;
  
  if (argumentCount != 3) {
    sysbvm_error_argumentCountMismatch(3,argumentCount);
  }
  local_78 = 0;
  sStack_70 = 0;
  local_88 = 0;
  sStack_80 = 0;
  local_68 = 0;
  local_58.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_58.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_58._12_4_ = 0;
  local_48 = 5;
  local_40 = (undefined1 *)&local_88;
  sysbvm_stackFrame_pushRecord(&local_58);
  sVar4 = *arguments;
  uVar2 = *(ulong *)(sVar4 + 0x100);
  if ((uVar2 & 0xf) == 0 && uVar2 != 0) {
    uVar3 = *(uint *)(uVar2 + 0xc) >> 3;
  }
  else {
    uVar3 = 0;
  }
  uVar2 = *(ulong *)(arguments[1] + 0x40);
  if ((uVar2 & 0xf) == 0 && uVar2 != 0) {
    slotCount = (sysbvm_tuple_t)(*(uint *)(uVar2 + 0xc) >> 3);
  }
  else {
    slotCount = 0;
  }
  lVar1 = *(long *)(arguments[1] + 0x28);
  if ((int)slotCount + (uint)(lVar1 != 0) == uVar3) {
    uVar2 = *(ulong *)(sVar4 + 0xf8);
    if (uVar2 == 0 || (uVar2 & 0xf) != 0) {
      uVar3 = (uint)((long)uVar2 >> 4);
    }
    else {
      uVar3 = (uint)*(undefined8 *)(uVar2 + 0x10);
    }
    if (lVar1 != 0) {
      uVar2 = *(ulong *)(sVar4 + 0x100);
      if ((uVar2 & 0xf) == 0 && uVar2 != 0) {
        local_68 = *(sysbvm_tuple_t *)(uVar2 + 0x10);
      }
      else {
        local_68 = 0;
      }
      local_88 = sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment
                           (context,*(sysbvm_tuple_t *)(arguments[1] + 0x28),local_68,arguments[2]);
      *(sysbvm_tuple_t *)(arguments[1] + 0x28) = local_88;
    }
    sStack_70 = sysbvm_array_create(context,slotCount);
    if (slotCount != 0) {
      sVar4 = 0;
      do {
        uVar2 = *(ulong *)(*arguments + 0x100);
        if ((uVar2 & 0xf) == 0 && uVar2 != 0) {
          local_68 = *(sysbvm_tuple_t *)(uVar2 + (ulong)(lVar1 != 0) * 8 + 0x10 + sVar4 * 8);
        }
        else {
          local_68 = 0;
        }
        uVar2 = *(ulong *)(arguments[1] + 0x40);
        if ((uVar2 & 0xf) == 0 && uVar2 != 0) {
          sStack_80 = *(sysbvm_tuple_t *)(uVar2 + 0x10 + sVar4 * 8);
        }
        else {
          sStack_80 = 0;
        }
        local_78 = sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment
                             (context,sStack_80,local_68,arguments[2]);
        if ((sStack_70 & 0xf) == 0 && sStack_70 != 0) {
          *(sysbvm_tuple_t *)(sStack_70 + 0x10 + sVar4 * 8) = local_78;
        }
        sVar4 = sVar4 + 1;
      } while (slotCount != sVar4);
    }
    sVar4 = arguments[1];
    *(sysbvm_tuple_t *)(sVar4 + 0x40) = sStack_70;
    *(undefined8 *)(sVar4 + 0x20) = *(undefined8 *)(*arguments + 0x108);
    uVar2 = *(ulong *)(sVar4 + 0x60);
    if (uVar2 == 0 || (uVar2 & 0xf) != 0) {
      uVar2 = (long)uVar2 >> 4;
    }
    else {
      uVar2 = *(ulong *)(uVar2 + 0x10);
    }
    *(ulong *)(sVar4 + 0x60) = ((~uVar3 & 0x600) != 0 | uVar2) << 4 | 0x2b;
    sysbvm_stackFrame_popRecord(&local_58);
    return arguments[1];
  }
  sysbvm_error("Expected number of arguments is mismatching.");
}

Assistant:

static sysbvm_tuple_t sysbvm_simpleFunctionType_primitiveAnalyzeAndTypeCheckMessageSendNode(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)closure;
    if(argumentCount != 3) sysbvm_error_argumentCountMismatch(3, argumentCount);

    sysbvm_simpleFunctionType_t **simpleFunctionType = (sysbvm_simpleFunctionType_t**)&arguments[0];
    sysbvm_astMessageSendNode_t **sendNode = (sysbvm_astMessageSendNode_t**)&arguments[1];
    sysbvm_tuple_t *environment = &arguments[2];

    struct {
        sysbvm_tuple_t analyzedReceiver;

        sysbvm_tuple_t argumentNode;
        sysbvm_tuple_t analyzedArgument;
        sysbvm_tuple_t analyzedArguments;
        sysbvm_tuple_t expectedArgumentType;
    } gcFrame = {0};

    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);

    size_t typeArgumentCount = sysbvm_array_getSize((*simpleFunctionType)->argumentTypes);
    size_t sendArgumentCount = sysbvm_array_getSize((*sendNode)->arguments);
    size_t sendArgumentStartIndex = (*sendNode)->receiver ? 1 : 0;

    size_t applicationArgumentCount = sendArgumentStartIndex + sendArgumentCount;
    if(applicationArgumentCount != typeArgumentCount)
        sysbvm_error("Expected number of arguments is mismatching.");

    sysbvm_bitflags_t flags = sysbvm_tuple_bitflags_decode((*simpleFunctionType)->super.functionFlags);
    bool isMemoizedTemplate = (flags & SYSBVM_FUNCTION_FLAGS_MEMOIZED_TEMPLATE) == SYSBVM_FUNCTION_FLAGS_MEMOIZED_TEMPLATE;

    // Analyze the receiver
    if(sendArgumentStartIndex > 0)
    {
        gcFrame.expectedArgumentType = sysbvm_array_at((*simpleFunctionType)->argumentTypes, 0);
        gcFrame.analyzedReceiver = sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment(context, (*sendNode)->receiver, gcFrame.expectedArgumentType, *environment);
        (*sendNode)->receiver = gcFrame.analyzedReceiver;
    }

    // Analyze the send arguments.
    gcFrame.analyzedArguments = sysbvm_array_create(context, sendArgumentCount);
    for(size_t i = 0; i < sendArgumentCount; ++i)
    {
        gcFrame.expectedArgumentType = sysbvm_array_at((*simpleFunctionType)->argumentTypes, sendArgumentStartIndex + i);
        gcFrame.argumentNode = sysbvm_array_at((*sendNode)->arguments, i);
        gcFrame.analyzedArgument = sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment(context, gcFrame.argumentNode, gcFrame.expectedArgumentType, *environment);
        sysbvm_array_atPut(gcFrame.analyzedArguments, i, gcFrame.analyzedArgument);
    }

    (*sendNode)->arguments = gcFrame.analyzedArguments;
    (*sendNode)->super.analyzedType = (*simpleFunctionType)->resultType;
    (*sendNode)->applicationFlags = sysbvm_tuple_bitflags_encode(sysbvm_tuple_bitflags_decode((*sendNode)->applicationFlags)
        | (isMemoizedTemplate ? 0 : SYSBVM_FUNCTION_APPLICATION_FLAGS_NO_TYPECHECK)
        | SYSBVM_FUNCTION_APPLICATION_FLAGS_VARIADIC_EXPANDED);

    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return (sysbvm_tuple_t)*sendNode;
}